

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void udata_checkCommonData_63(UDataMemory *udm,UErrorCode *err)

{
  uint8_t uVar1;
  DataHeader *pDVar2;
  commonDataFuncs *pcVar3;
  
  if (U_ZERO_ERROR < *err) {
    return;
  }
  if ((((udm != (UDataMemory *)0x0) && (pDVar2 = udm->pHeader, pDVar2 != (DataHeader *)0x0)) &&
      ((pDVar2->dataHeader).magic1 == 0xda)) &&
     ((((pDVar2->dataHeader).magic2 == '\'' && ((pDVar2->info).isBigEndian == '\0')) &&
      ((pDVar2->info).charsetFamily == '\0')))) {
    uVar1 = (pDVar2->info).dataFormat[0];
    if (uVar1 == 'T') {
      if ((((pDVar2->info).dataFormat[1] == 'o') && ((pDVar2->info).dataFormat[2] == 'C')) &&
         (((pDVar2->info).dataFormat[3] == 'P' && ((pDVar2->info).formatVersion[0] == '\x01')))) {
        pcVar3 = &ToCPFuncs;
        goto LAB_002e7643;
      }
    }
    else if ((((uVar1 == 'C') && ((pDVar2->info).dataFormat[1] == 'm')) &&
             ((pDVar2->info).dataFormat[2] == 'n')) &&
            (((pDVar2->info).dataFormat[3] == 'D' && ((pDVar2->info).formatVersion[0] == '\x01'))))
    {
      pcVar3 = &CmnDFuncs;
LAB_002e7643:
      udm->vFuncs = pcVar3;
      udm->toc = (pDVar2->info).dataFormat + ((ulong)(pDVar2->dataHeader).headerSize - 0xc);
      return;
    }
  }
  *err = U_INVALID_FORMAT_ERROR;
  udata_close_63(udm);
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }